

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O1

Instruction * __thiscall spvtools::opt::Loop::GetConditionInst(Loop *this)

{
  IRContext *this_00;
  DefUseManager *this_01;
  uint32_t uVar1;
  BasicBlock *pBVar2;
  Instruction *pIVar3;
  
  pBVar2 = FindConditionBlock(this);
  if (pBVar2 != (BasicBlock *)0x0) {
    pIVar3 = (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar3 == (Instruction *)0x0) ||
       ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
      __assert_fail("!insts_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                    ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
    }
    pIVar3 = (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
    if (pIVar3->opcode_ == OpBranchConditional) {
      this_00 = this->context_;
      if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(this_00);
      }
      this_01 = (this_00->def_use_mgr_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl
      ;
      uVar1 = (pIVar3->has_result_id_ & 1) + 1;
      if (pIVar3->has_type_id_ == false) {
        uVar1 = (uint)pIVar3->has_result_id_;
      }
      uVar1 = Instruction::GetSingleWordOperand(pIVar3,uVar1);
      pIVar3 = analysis::DefUseManager::GetDef(this_01,uVar1);
      if (7 < pIVar3->opcode_ - OpUGreaterThan) {
        return (Instruction *)0x0;
      }
      return pIVar3;
    }
  }
  return (Instruction *)0x0;
}

Assistant:

Instruction* Loop::GetConditionInst() const {
  BasicBlock* condition_block = FindConditionBlock();
  if (!condition_block) {
    return nullptr;
  }
  Instruction* branch_conditional = &*condition_block->tail();
  if (!branch_conditional ||
      branch_conditional->opcode() != spv::Op::OpBranchConditional) {
    return nullptr;
  }
  Instruction* condition_inst = context_->get_def_use_mgr()->GetDef(
      branch_conditional->GetSingleWordInOperand(0));
  if (IsSupportedCondition(condition_inst->opcode())) {
    return condition_inst;
  }

  return nullptr;
}